

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::Vector::IsSameImpl(Vector *this,Type *that,IsSameCache *seen)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  bool local_39;
  Vector *vt;
  IsSameCache *seen_local;
  Type *that_local;
  Vector *this_local;
  long lVar3;
  
  iVar1 = (*that->_vptr_Type[0xe])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_39 = false;
    if (this->count_ == *(uint32_t *)(lVar3 + 0x30)) {
      uVar2 = (*this->element_type_->_vptr_Type[2])
                        (this->element_type_,*(undefined8 *)(lVar3 + 0x28),seen);
      local_39 = false;
      if ((uVar2 & 1) != 0) {
        local_39 = analysis::Type::HasSameDecorations(&this->super_Type,that);
      }
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool Vector::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Vector* vt = that->AsVector();
  if (!vt) return false;
  return count_ == vt->count_ &&
         element_type_->IsSameImpl(vt->element_type_, seen) &&
         HasSameDecorations(that);
}